

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_ordered_member_location
          (CompilerMSL *this,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Decoration *pDVar4;
  Decoration *dec;
  mapped_type *local_30;
  mapped_type *m;
  uint32_t *comp_local;
  uint32_t index_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  m = (mapped_type *)comp;
  comp_local._0_4_ = index;
  comp_local._4_4_ = type_id;
  _index_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&dec + 4),type_id);
  local_30 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                          (key_type *)((long)&dec + 4));
  uVar2 = (ulong)(uint32_t)comp_local;
  sVar3 = VectorView<spirv_cross::Meta::Decoration>::size
                    (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>);
  if (uVar2 < sVar3) {
    pDVar4 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)(uint32_t)comp_local);
    if (m != (mapped_type *)0x0) {
      bVar1 = Bitset::get(&pDVar4->decoration_flags,0x1f);
      if (bVar1) {
        *(uint32_t *)&m->decoration = pDVar4->component;
      }
      else {
        *(undefined4 *)&m->decoration = 0xffffffff;
      }
    }
    bVar1 = Bitset::get(&pDVar4->decoration_flags,0x1e);
    if (bVar1) {
      return pDVar4->location;
    }
  }
  return (uint32_t)comp_local;
}

Assistant:

uint32_t CompilerMSL::get_ordered_member_location(uint32_t type_id, uint32_t index, uint32_t *comp)
{
	auto &m = ir.meta[type_id];
	if (index < m.members.size())
	{
		auto &dec = m.members[index];
		if (comp)
		{
			if (dec.decoration_flags.get(DecorationComponent))
				*comp = dec.component;
			else
				*comp = k_unknown_component;
		}
		if (dec.decoration_flags.get(DecorationLocation))
			return dec.location;
	}

	return index;
}